

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

uchar FSE_decodeSymbol(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t lowBits;
  ushort uStack_6c;
  uchar uStack_6a;
  BYTE symbol;
  U32 nbBits;
  FSE_decode_t DInfo;
  BIT_DStream_t *bitD_local;
  FSE_DState_t *DStatePtr_local;
  size_t value;
  U32 regMask;
  
  uVar1 = *(uint *)((long)DStatePtr->table + DStatePtr->state * 4);
  uStack_6a = (uchar)(uVar1 >> 0x10);
  uVar2 = bitD->bitsConsumed;
  uVar3 = BIT_mask[uVar1 >> 0x18];
  bitD->bitsConsumed = (uVar1 >> 0x18) + bitD->bitsConsumed;
  uStack_6c = (ushort)uVar1;
  DStatePtr->state =
       (ulong)uStack_6c +
       (bitD->bitContainer >> (('@' - (char)uVar2) - (char)(uVar1 >> 0x18) & 0x3fU) & (ulong)uVar3);
  return uStack_6a;
}

Assistant:

MEM_STATIC BYTE FSE_decodeSymbol(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD)
{
    FSE_decode_t const DInfo = ((const FSE_decode_t*)(DStatePtr->table))[DStatePtr->state];
    U32 const nbBits = DInfo.nbBits;
    BYTE const symbol = DInfo.symbol;
    size_t const lowBits = BIT_readBits(bitD, nbBits);

    DStatePtr->state = DInfo.newState + lowBits;
    return symbol;
}